

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Chapters::Atom::ExpandDisplaysArray(Atom *this)

{
  Display *pDVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  Display *this_00;
  long in_RDI;
  ulong uVar6;
  int idx;
  Display *displays;
  int size;
  Display *local_a0;
  Display *local_78;
  int local_6c;
  int local_60;
  bool local_1;
  
  if (*(int *)(in_RDI + 0x2c) < *(int *)(in_RDI + 0x28)) {
    local_1 = true;
  }
  else {
    if (*(int *)(in_RDI + 0x28) == 0) {
      local_6c = 1;
    }
    else {
      local_6c = *(int *)(in_RDI + 0x28) << 1;
    }
    uVar3 = (ulong)local_6c;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0x18),0);
    uVar6 = uVar4 + 8;
    if (SUB168(auVar2 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    local_78 = (Display *)0x0;
    if (puVar5 != (ulong *)0x0) {
      *puVar5 = uVar3;
      local_78 = (Display *)(puVar5 + 1);
      if (uVar3 != 0) {
        local_a0 = local_78;
        do {
          Display::Display(local_a0);
          local_a0 = local_a0 + 1;
        } while (local_a0 != local_78 + uVar3);
      }
    }
    if (local_78 == (Display *)0x0) {
      local_1 = false;
    }
    else {
      for (local_60 = 0; local_60 < *(int *)(in_RDI + 0x2c); local_60 = local_60 + 1) {
        Display::ShallowCopy
                  ((Display *)(*(long *)(in_RDI + 0x20) + (long)local_60 * 0x18),local_78 + local_60
                  );
      }
      pDVar1 = *(Display **)(in_RDI + 0x20);
      if (pDVar1 != (Display *)0x0) {
        this_00 = pDVar1 + (long)pDVar1[-1].m_country;
        while (pDVar1 != this_00) {
          this_00 = this_00 + -1;
          Display::~Display(this_00);
        }
        operator_delete__(&pDVar1[-1].m_country);
      }
      *(Display **)(in_RDI + 0x20) = local_78;
      *(int *)(in_RDI + 0x28) = local_6c;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Chapters::Atom::ExpandDisplaysArray() {
  if (m_displays_size > m_displays_count)
    return true;  // nothing else to do

  const int size = (m_displays_size == 0) ? 1 : 2 * m_displays_size;

  Display* const displays = new (std::nothrow) Display[size];

  if (displays == NULL)
    return false;

  for (int idx = 0; idx < m_displays_count; ++idx) {
    m_displays[idx].ShallowCopy(displays[idx]);
  }

  delete[] m_displays;
  m_displays = displays;

  m_displays_size = size;
  return true;
}